

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaCom.c
# Opt level: O2

void Pla_AbcFreeMan(Abc_Frame_t *pAbc)

{
  undefined8 *__ptr;
  
  __ptr = (undefined8 *)pAbc->pAbcPla;
  if (__ptr != (undefined8 *)0x0) {
    Vec_IntErase((Vec_Int_t *)(__ptr + 5));
    Vec_IntErase((Vec_Int_t *)(__ptr + 7));
    Vec_WrdErase((Vec_Wrd_t *)(__ptr + 9));
    Vec_WrdErase((Vec_Wrd_t *)(__ptr + 0xb));
    Vec_WecErase((Vec_Wec_t *)(__ptr + 0xd));
    Vec_WecErase((Vec_Wec_t *)(__ptr + 0xf));
    Vec_IntErase((Vec_Int_t *)(__ptr + 0x11));
    if ((void *)*__ptr != (void *)0x0) {
      free((void *)*__ptr);
      *__ptr = 0;
    }
    free((void *)__ptr[1]);
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static inline void        Pla_AbcFreeMan( Abc_Frame_t * pAbc )                   { if ( pAbc->pAbcPla ) Pla_ManFree(Pla_AbcGetMan(pAbc));  }